

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnRefNullExpr(BinaryReaderInterp *this,Type type)

{
  bool bVar1;
  Location local_48;
  Enum local_24;
  BinaryReaderInterp *local_20;
  BinaryReaderInterp *this_local;
  Type type_local;
  
  local_20 = this;
  unique0x100000b6 = type;
  GetLocation(&local_48,this);
  local_24 = (Enum)SharedValidator::OnRefNull(&this->validator_,&local_48,stack0xffffffffffffffec);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)&type_local,Error);
  }
  else {
    Istream::Emit(this->istream_,RefNull);
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnRefNullExpr(Type type) {
  CHECK_RESULT(validator_.OnRefNull(GetLocation(), type));
  istream_.Emit(Opcode::RefNull);
  return Result::Ok;
}